

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O0

void do_cmd_redraw(void)

{
  _Bool _Var1;
  loc local_10;
  loc target;
  
  Term_flush();
  event_signal(EVENT_INPUT_FLUSH);
  if ((character_dungeon & 1U) != 0) {
    verify_panel();
  }
  Term_xtra(L'\n',L'\0');
  if ((character_dungeon & 1U) != 0) {
    player->upkeep->notice = player->upkeep->notice | 1;
    player->upkeep->update = player->upkeep->update | 0x202;
    player->upkeep->update = player->upkeep->update | 0x15;
    player->upkeep->update = player->upkeep->update | 0x60;
    player->upkeep->redraw = player->upkeep->redraw | 0xffbfff;
  }
  Term_clear();
  if ((character_dungeon & 1U) != 0) {
    handle_stuff(player);
    if ((((character_dungeon & 1U) == 0) || (((player->opts).opt[8] & 1U) == 0)) ||
       (_Var1 = target_sighted(), !_Var1)) {
      move_cursor_relative((player->grid).y,(player->grid).x);
    }
    else {
      target_get(&local_10);
      move_cursor_relative(local_10.y,local_10.x);
    }
  }
  Term_redraw_all();
  return;
}

Assistant:

void do_cmd_redraw(void)
{
	/* Low level flush */
	Term_flush();

	/* Reset "inkey()" */
	event_signal(EVENT_INPUT_FLUSH);

	if (character_dungeon)
		verify_panel();

	/* Hack -- React to changes */
	Term_xtra(TERM_XTRA_REACT, 0);

	if (character_dungeon) {
		/* Combine the pack (later) */
		player->upkeep->notice |= (PN_COMBINE);

		/* Update torch, gear */
		player->upkeep->update |= (PU_TORCH | PU_INVEN);

		/* Update stuff */
		player->upkeep->update |= (PU_BONUS | PU_HP | PU_SPELLS);

		/* Fully update the visuals */
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

		/* Redraw everything */
		player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_INVEN |
								   PR_EQUIP | PR_MESSAGE | PR_MONSTER |
								   PR_OBJECT | PR_MONLIST | PR_ITEMLIST);
	}

	/* Clear screen */
	Term_clear();

	if (character_dungeon) {
		/* Hack -- update */
		handle_stuff(player);

		/* Place the cursor on the player */
		if ((0 != character_dungeon) && OPT(player, show_target) &&
			target_sighted()) {
			struct loc target;
			target_get(&target);
			move_cursor_relative(target.y, target.x);
		} else {
			move_cursor_relative(player->grid.y, player->grid.x);
		}
	}

	/* Redraw every window */
	(void) Term_redraw_all();
}